

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O0

boolean intended_cdt(int cdt)

{
  undefined1 local_9;
  int cdt_local;
  
  if ((cdt == 0) && (flags.pacifist != '\0')) {
    local_9 = '\x01';
  }
  else if ((cdt == 2) && (flags.atheist != '\0')) {
    local_9 = '\x01';
  }
  else if ((cdt == 3) && (flags.nudist != '\0')) {
    local_9 = '\x01';
  }
  else if ((cdt == 4) && (flags.blindfolded != '\0')) {
    local_9 = '\x01';
  }
  else if ((cdt == 5) && (flags.ascet != '\0')) {
    local_9 = '\x01';
  }
  else if ((cdt == 6) && (flags.vegan != '\0')) {
    local_9 = '\x01';
  }
  else if ((cdt == 7) && (flags.vegetarian != '\0')) {
    local_9 = '\x01';
  }
  else if ((cdt == 8) && (flags.illiterate != '\0')) {
    local_9 = '\x01';
  }
  else {
    local_9 = '\0';
  }
  return local_9;
}

Assistant:

boolean intended_cdt(int cdt)
{
	if (cdt == CONDUCT_PACIFISM && flags.pacifist) return TRUE;
	if (cdt == CONDUCT_ATHEISM && flags.atheist) return TRUE;
	if (cdt == CONDUCT_NUDISM && flags.nudist) return TRUE;
	if (cdt == CONDUCT_BLINDFOLDED && flags.blindfolded) return TRUE;
	if (cdt == CONDUCT_FOODLESS && flags.ascet) return TRUE;
	if (cdt == CONDUCT_VEGAN && flags.vegan) return TRUE;
	if (cdt == CONDUCT_VEGETARIAN && flags.vegetarian) return TRUE;
	if (cdt == CONDUCT_ILLITERACY && flags.illiterate) return TRUE;

	return FALSE;
}